

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_pred_context_switchable_interp(MACROBLOCKD *xd,int dir)

{
  InterpFilter IVar1;
  int iVar2;
  int iVar3;
  uint in_ESI;
  long in_RDI;
  int above_type;
  int left_type;
  int filter_type_ctx;
  MV_REFERENCE_FRAME ref_frame;
  int ctx_offset;
  MB_MODE_INFO *mbmi;
  MV_REFERENCE_FRAME in_stack_ffffffffffffffd3;
  uint dir_00;
  uint uVar4;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  
  iVar2 = (uint)('\0' < *(char *)(**(long **)(in_RDI + 0x1eb8) + 0x11)) * 4;
  uVar5 = CONCAT13(*(undefined1 *)(**(long **)(in_RDI + 0x1eb8) + 0x10),in_stack_ffffffffffffffe0);
  iVar3 = iVar2 + (in_ESI & 1) * 8;
  uVar4 = 3;
  dir_00 = 3;
  if ((*(byte *)(in_RDI + 0x1ec1) & 1) != 0) {
    IVar1 = get_ref_filter_type((MB_MODE_INFO *)CONCAT44(iVar2,uVar5),
                                (MACROBLOCKD *)CONCAT44(iVar3,3),3,in_stack_ffffffffffffffd3);
    uVar4 = (uint)IVar1;
  }
  if ((*(byte *)(in_RDI + 0x1ec0) & 1) != 0) {
    IVar1 = get_ref_filter_type((MB_MODE_INFO *)CONCAT44(iVar2,uVar5),
                                (MACROBLOCKD *)CONCAT44(iVar3,uVar4),dir_00,
                                in_stack_ffffffffffffffd3);
    dir_00 = (uint)IVar1;
  }
  if (uVar4 == dir_00) {
    iVar3 = uVar4 + iVar3;
  }
  else if (uVar4 == 3) {
    iVar3 = dir_00 + iVar3;
  }
  else if (dir_00 == 3) {
    iVar3 = uVar4 + iVar3;
  }
  else {
    iVar3 = iVar3 + 3;
  }
  return iVar3;
}

Assistant:

int av1_get_pred_context_switchable_interp(const MACROBLOCKD *xd, int dir) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int ctx_offset =
      (mbmi->ref_frame[1] > INTRA_FRAME) * INTER_FILTER_COMP_OFFSET;
  assert(dir == 0 || dir == 1);
  const MV_REFERENCE_FRAME ref_frame = mbmi->ref_frame[0];
  // Note:
  // The mode info data structure has a one element border above and to the
  // left of the entries corresponding to real macroblocks.
  // The prediction flags in these dummy entries are initialized to 0.
  int filter_type_ctx = ctx_offset + (dir & 0x01) * INTER_FILTER_DIR_OFFSET;
  int left_type = SWITCHABLE_FILTERS;
  int above_type = SWITCHABLE_FILTERS;

  if (xd->left_available)
    left_type = get_ref_filter_type(xd->mi[-1], xd, dir, ref_frame);

  if (xd->up_available)
    above_type =
        get_ref_filter_type(xd->mi[-xd->mi_stride], xd, dir, ref_frame);

  if (left_type == above_type) {
    filter_type_ctx += left_type;
  } else if (left_type == SWITCHABLE_FILTERS) {
    assert(above_type != SWITCHABLE_FILTERS);
    filter_type_ctx += above_type;
  } else if (above_type == SWITCHABLE_FILTERS) {
    assert(left_type != SWITCHABLE_FILTERS);
    filter_type_ctx += left_type;
  } else {
    filter_type_ctx += SWITCHABLE_FILTERS;
  }

  return filter_type_ctx;
}